

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall OpenMesh::PolyConnectivity::collapse_edge(PolyConnectivity *this,HalfedgeHandle _hh)

{
  bool bVar1;
  HalfedgeHandle _nheh;
  HalfedgeHandle _heh;
  HalfedgeHandle _nheh_00;
  HalfedgeHandle _heh_00;
  VertexHandle _vh;
  VertexHandle _vh_00;
  EdgeHandle _eh;
  StatusInfo *pSVar2;
  BaseHandle local_b0;
  BaseHandle local_ac;
  BaseHandle local_a8;
  BaseHandle local_a4;
  BaseHandle local_a0;
  BaseHandle local_9c;
  BaseHandle local_98;
  BaseHandle local_94;
  BaseHandle local_90;
  BaseHandle local_8c;
  BaseHandle local_88;
  BaseHandle local_84;
  undefined1 local_80 [8];
  VertexIHalfedgeIter vih_it;
  VertexHandle vo;
  VertexHandle vh;
  FaceHandle fo;
  FaceHandle fh;
  HalfedgeHandle op;
  HalfedgeHandle on;
  HalfedgeHandle o;
  HalfedgeHandle hp;
  HalfedgeHandle hn;
  HalfedgeHandle h;
  PolyConnectivity *this_local;
  HalfedgeHandle _hh_local;
  
  _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_hh);
  _heh = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_hh);
  on = ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,_hh);
  _nheh_00 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,on);
  _heh_00 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,on);
  fo = ArrayKernel::face_handle(&this->super_ArrayKernel,_hh);
  vh.super_BaseHandle.idx_ = (BaseHandle)ArrayKernel::face_handle(&this->super_ArrayKernel,on);
  _vh = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,_hh);
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = on.super_BaseHandle.idx_;
  _vh_00 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,on);
  local_84 = _vh_00.super_BaseHandle.idx_;
  vih_iter((VertexIHalfedgeIter *)local_80,this,_vh_00);
  while (bVar1 = Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                 ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                             *)local_80), bVar1) {
    local_88.idx_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                           *)local_80);
    local_8c = _vh.super_BaseHandle.idx_;
    ArrayKernel::set_vertex_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_88.idx_,_vh);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
                  *)local_80);
  }
  local_94 = _nheh.super_BaseHandle.idx_;
  local_90 = _heh.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh);
  local_9c = _nheh_00.super_BaseHandle.idx_;
  local_98 = _heh_00.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_nheh_00);
  bVar1 = BaseHandle::is_valid(&fo.super_BaseHandle);
  if (bVar1) {
    local_a0 = fo.super_BaseHandle.idx_;
    local_a4 = _nheh.super_BaseHandle.idx_;
    ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,fo,_nheh);
  }
  bVar1 = BaseHandle::is_valid(&vh.super_BaseHandle);
  if (bVar1) {
    local_a8 = vh.super_BaseHandle.idx_;
    local_ac = _nheh_00.super_BaseHandle.idx_;
    ArrayKernel::set_halfedge_handle
              (&this->super_ArrayKernel,(FaceHandle)vh.super_BaseHandle.idx_,_nheh_00);
  }
  local_b0.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
  bVar1 = BaseHandle::operator==(&local_b0,&on.super_BaseHandle);
  if (bVar1) {
    ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,_vh,_nheh);
  }
  adjust_outgoing_halfedge(this,_vh);
  ArrayKernel::set_isolated(&this->super_ArrayKernel,_vh_00);
  _eh = ArrayKernel::edge_handle(&this->super_ArrayKernel,_hh);
  pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  Attributes::StatusInfo::set_deleted(pSVar2,true);
  pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,_vh_00);
  Attributes::StatusInfo::set_deleted(pSVar2,true);
  return;
}

Assistant:

void PolyConnectivity::collapse_edge(HalfedgeHandle _hh)
{
  HalfedgeHandle  h  = _hh;
  HalfedgeHandle  hn = next_halfedge_handle(h);
  HalfedgeHandle  hp = prev_halfedge_handle(h);

  HalfedgeHandle  o  = opposite_halfedge_handle(h);
  HalfedgeHandle  on = next_halfedge_handle(o);
  HalfedgeHandle  op = prev_halfedge_handle(o);

  FaceHandle      fh = face_handle(h);
  FaceHandle      fo = face_handle(o);

  VertexHandle    vh = to_vertex_handle(h);
  VertexHandle    vo = to_vertex_handle(o);



  // halfedge -> vertex
  for (VertexIHalfedgeIter vih_it(vih_iter(vo)); vih_it.is_valid(); ++vih_it)
    set_vertex_handle(*vih_it, vh);


  // halfedge -> halfedge
  set_next_halfedge_handle(hp, hn);
  set_next_halfedge_handle(op, on);


  // face -> halfedge
  if (fh.is_valid())  set_halfedge_handle(fh, hn);
  if (fo.is_valid())  set_halfedge_handle(fo, on);


  // vertex -> halfedge
  if (halfedge_handle(vh) == o)  set_halfedge_handle(vh, hn);
  adjust_outgoing_halfedge(vh);
  set_isolated(vo);

  // delete stuff
  status(edge_handle(h)).set_deleted(true);
  status(vo).set_deleted(true);
}